

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heightmap.c
# Opt level: O0

GLuint make_shader_program(char *vertex_shader_src,char *fragment_shader_src)

{
  char *local_2048;
  char *local_2040;
  GLchar local_2038 [8];
  char info_log [8192];
  GLsizei local_2c;
  GLuint local_28;
  GLsizei log_length;
  GLuint fragment_shader;
  GLuint vertex_shader;
  GLint program_ok;
  GLuint program;
  char *fragment_shader_src_local;
  char *vertex_shader_src_local;
  
  vertex_shader = 0;
  log_length = 0;
  local_28 = 0;
  local_2040 = vertex_shader_src;
  if (vertex_shader_src == (char *)0x0) {
    local_2040 = default_vertex_shader;
  }
  _program_ok = fragment_shader_src;
  fragment_shader_src_local = vertex_shader_src;
  log_length = make_shader(0x8b31,local_2040);
  if (log_length == 0) {
    fprintf(_stderr,"ERROR: Unable to load vertex shader\n");
  }
  else {
    if (_program_ok == (char *)0x0) {
      local_2048 = default_fragment_shader;
    }
    else {
      local_2048 = _program_ok;
    }
    local_28 = make_shader(0x8b30,local_2048);
    if (local_28 == 0) {
      fprintf(_stderr,"ERROR: Unable to load fragment shader\n");
      (*pglDeleteShader)(log_length);
    }
    else {
      vertex_shader = (*pglCreateProgram)();
      if (vertex_shader != 0) {
        (*pglAttachShader)(vertex_shader,log_length);
        (*pglAttachShader)(vertex_shader,local_28);
        (*pglLinkProgram)(vertex_shader);
        (*pglGetProgramiv)(vertex_shader,0x8b82,(GLint *)&fragment_shader);
        if (fragment_shader != 1) {
          fprintf(_stderr,"ERROR, failed to link shader program\n");
          (*pglGetProgramInfoLog)(vertex_shader,0x2000,&local_2c,local_2038);
          fprintf(_stderr,"ERROR: \n%s\n\n",local_2038);
          (*pglDeleteProgram)(vertex_shader);
          (*pglDeleteShader)(local_28);
          (*pglDeleteShader)(log_length);
          vertex_shader = 0;
        }
      }
    }
  }
  return vertex_shader;
}

Assistant:

static GLuint make_shader_program(const char* vertex_shader_src, const char* fragment_shader_src)
{
    GLuint program = 0u;
    GLint program_ok;
    GLuint vertex_shader = 0u;
    GLuint fragment_shader = 0u;
    GLsizei log_length;
    char info_log[8192];

    vertex_shader = make_shader(GL_VERTEX_SHADER, (vertex_shader_src == NULL) ? default_vertex_shader : vertex_shader_src);
    if (vertex_shader != 0u)
    {
        fragment_shader = make_shader(GL_FRAGMENT_SHADER, (fragment_shader_src == NULL) ? default_fragment_shader : fragment_shader_src);
        if (fragment_shader != 0u)
        {
            /* make the program that connect the two shader and link it */
            program = pglCreateProgram();
            if (program != 0u)
            {
                /* attach both shader and link */
                pglAttachShader(program, vertex_shader);
                pglAttachShader(program, fragment_shader);
                pglLinkProgram(program);
                pglGetProgramiv(program, GL_LINK_STATUS, &program_ok);

                if (program_ok != GL_TRUE)
                {
                    fprintf(stderr, "ERROR, failed to link shader program\n");
                    pglGetProgramInfoLog(program, 8192, &log_length, info_log);
                    fprintf(stderr, "ERROR: \n%s\n\n", info_log);
                    pglDeleteProgram(program);
                    pglDeleteShader(fragment_shader);
                    pglDeleteShader(vertex_shader);
                    program = 0u;
                }
            }
        }
        else
        {
            fprintf(stderr, "ERROR: Unable to load fragment shader\n");
            pglDeleteShader(vertex_shader);
        }
    }
    else
    {
        fprintf(stderr, "ERROR: Unable to load vertex shader\n");
    }
    return program;
}